

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O0

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  const_reference pvVar1;
  size_type sVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar3;
  uchar *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int i_1;
  uchar *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int channels_2;
  int h_2;
  uchar *ptr_4;
  int size_2;
  Mat *bottom_blob_9;
  size_t b_9;
  uchar *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int channels_1;
  int w_3;
  uchar *outptr_3;
  uchar *ptr_3;
  size_t size_1;
  int channels;
  Mat *bottom_blob_7;
  size_t b_7;
  int q;
  Mat *top_blob_3;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int h_1;
  int w_2;
  uchar *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  uchar *outptr_2;
  int i;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int h;
  uchar *ptr_1;
  int size;
  Mat *bottom_blob_3;
  size_t b_3;
  uchar *outptr_1;
  Mat *top_blob_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int w_1;
  uchar *ptr;
  int w;
  Mat *bottom_blob_1;
  size_t b_1;
  uchar *outptr;
  Mat *top_blob;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  int positive_axis;
  size_t elemsize;
  int dims;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_fffffffffffff648;
  Allocator *in_stack_fffffffffffff650;
  size_t in_stack_fffffffffffff658;
  int iVar4;
  Mat *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  ulong uVar5;
  Mat *in_stack_fffffffffffff670;
  int local_834;
  undefined8 local_828;
  undefined8 local_820;
  undefined8 local_818;
  undefined4 local_810;
  Allocator *local_808;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined8 local_7e8;
  void *local_7e0;
  const_reference local_7d8;
  ulong local_7d0;
  int local_7c4;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined4 local_7a8;
  Allocator *local_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined8 local_780;
  void *local_778;
  int local_76c;
  reference local_768;
  const_reference local_760;
  ulong local_758;
  int local_74c;
  int local_748;
  int local_744;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined4 local_728;
  Allocator *local_720;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined8 local_700;
  void *local_6f8;
  int local_6ec;
  const_reference local_6e8;
  ulong local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined8 local_6c8;
  undefined4 local_6c0;
  Allocator *local_6b8;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined8 local_698;
  void *local_690;
  int local_684;
  reference local_680;
  const_reference local_678;
  ulong local_670;
  int local_668;
  int local_664;
  int local_660;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined4 local_638;
  Allocator *local_630;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  undefined8 local_610;
  void *local_608;
  void *local_600;
  long local_5f8;
  int local_5ec;
  const_reference local_5e8;
  ulong local_5e0;
  int local_5d4;
  reference local_5d0;
  const_reference local_5c8;
  ulong local_5c0;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  void *local_5a8;
  const_reference local_5a0;
  ulong local_598;
  void *local_590;
  int local_584;
  reference local_580;
  const_reference local_578;
  ulong local_570;
  int local_568;
  int local_564;
  void *local_560;
  int local_554;
  const_reference local_550;
  ulong local_548;
  void *local_540;
  reference local_538;
  const_reference local_530;
  ulong local_528;
  int local_520;
  int local_51c;
  void *local_518;
  int local_50c;
  const_reference local_508;
  ulong local_500;
  void *local_4f8;
  reference local_4f0;
  const_reference local_4e8;
  ulong local_4e0;
  int local_4d8;
  int local_4d4;
  size_t local_4d0;
  int local_4c4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_4b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_4b0;
  int local_49c;
  reference local_498;
  reference local_490;
  reference local_488;
  reference local_480;
  reference local_478;
  reference local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  reference local_450;
  reference local_448;
  undefined8 *local_440;
  const_reference local_438;
  const_reference local_430;
  const_reference local_428;
  int local_41c;
  reference local_418;
  int local_40c;
  undefined8 *local_408;
  int local_3fc;
  const_reference local_3f8;
  undefined1 local_3ed;
  int local_3ec;
  reference local_3e8;
  undefined8 *local_3e0;
  undefined1 local_3d5;
  int local_3d4;
  reference local_3d0;
  undefined8 *local_3c8;
  undefined1 local_3bd;
  int local_3bc;
  reference local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_390;
  undefined8 *local_380;
  undefined8 *local_370;
  undefined8 *local_360;
  undefined8 *local_350;
  undefined1 local_33d;
  int local_33c;
  const_reference local_338;
  undefined8 *local_330;
  undefined1 local_31d;
  int local_31c;
  const_reference local_318;
  undefined8 *local_310;
  reference local_300;
  reference local_2f8;
  reference local_2f0;
  reference local_2e8;
  reference local_2e0;
  reference local_2d8;
  Allocator *local_2d0;
  int local_2c4;
  size_t local_2c0;
  void *local_2b8;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  Allocator *local_298;
  int local_28c;
  size_t local_288;
  void *local_280;
  int local_274;
  int local_270;
  int local_26c;
  undefined8 *local_268;
  Allocator *local_260;
  int local_254;
  size_t local_250;
  void *local_248;
  int local_23c;
  int local_238;
  int local_234;
  undefined8 *local_230;
  Allocator *local_228;
  int local_21c;
  size_t local_218;
  void *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  undefined8 *local_1f8;
  Allocator *local_1f0;
  int local_1e4;
  size_t local_1e0;
  void *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  undefined8 *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  undefined4 local_194;
  long local_190;
  undefined4 local_184;
  long local_180;
  undefined4 local_174;
  long local_170;
  undefined8 *local_130;
  undefined8 *local_110;
  undefined8 *local_f0;
  undefined8 *local_d0;
  undefined8 *local_b0;
  
  local_4b8 = in_RDX;
  local_4b0 = in_RSI;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_4c4 = pvVar1->dims;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
  local_4d0 = pvVar1->elemsize;
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_834 = local_4c4 + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_834 = *(int *)(in_RDI + 0xd0);
  }
  local_4d4 = local_834;
  if (local_4c4 == 1) {
    local_4d8 = 0;
    local_4e0 = 0;
    while( true ) {
      uVar5 = local_4e0;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0);
      iVar4 = (int)(in_stack_fffffffffffff658 >> 0x20);
      if (sVar2 <= uVar5) break;
      local_4e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4b0,local_4e0);
      local_4d8 = local_4e8->w + local_4d8;
      local_4e0 = local_4e0 + 1;
    }
    local_4f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b8,0);
    Mat::create(in_stack_fffffffffffff660,iVar4,(size_t)in_stack_fffffffffffff650,
                in_stack_fffffffffffff648);
    local_470 = local_4f0;
    bVar3 = true;
    if (local_4f0->data != (void *)0x0) {
      local_300 = local_4f0;
      bVar3 = local_4f0->cstep * (long)local_4f0->c == 0;
    }
    if (bVar3) {
      local_49c = -100;
    }
    else {
      local_448 = local_4f0;
      local_4f8 = local_4f0->data;
      for (local_500 = 0; uVar5 = local_500,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0), uVar5 < sVar2
          ; local_500 = local_500 + 1) {
        local_508 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_4b0,local_500);
        local_50c = local_508->w;
        local_518 = local_508->data;
        local_428 = local_508;
        memcpy(local_4f8,local_518,(long)local_50c * local_4d0);
        local_4f8 = (void *)((long)local_50c * local_4d0 + (long)local_4f8);
      }
      local_49c = 0;
    }
  }
  else if ((local_4c4 == 2) && (local_834 == 0)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_51c = pvVar1->w;
    local_520 = 0;
    for (local_528 = 0; uVar5 = local_528,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0), uVar5 < sVar2;
        local_528 = local_528 + 1) {
      local_530 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4b0,local_528);
      local_520 = local_530->h + local_520;
    }
    local_538 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b8,0);
    Mat::create(in_stack_fffffffffffff660,(int)(in_stack_fffffffffffff658 >> 0x20),
                (int)in_stack_fffffffffffff658,(size_t)in_stack_fffffffffffff650,
                in_stack_fffffffffffff648);
    local_478 = local_538;
    bVar3 = true;
    if (local_538->data != (void *)0x0) {
      local_2f8 = local_538;
      bVar3 = local_538->cstep * (long)local_538->c == 0;
    }
    if (bVar3) {
      local_49c = -100;
    }
    else {
      local_450 = local_538;
      local_540 = local_538->data;
      for (local_548 = 0; uVar5 = local_548,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0), uVar5 < sVar2
          ; local_548 = local_548 + 1) {
        local_550 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_4b0,local_548);
        local_554 = local_51c * local_550->h;
        local_560 = local_550->data;
        local_430 = local_550;
        memcpy(local_540,local_560,(long)local_554 * local_4d0);
        local_540 = (void *)((long)local_554 * local_4d0 + (long)local_540);
      }
      local_49c = 0;
    }
  }
  else if ((local_4c4 == 2) && (local_834 == 1)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_564 = pvVar1->h;
    local_568 = 0;
    for (local_570 = 0; uVar5 = local_570,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0), uVar5 < sVar2;
        local_570 = local_570 + 1) {
      local_578 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4b0,local_570);
      local_568 = local_578->w + local_568;
    }
    local_580 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b8,0);
    Mat::create(in_stack_fffffffffffff660,(int)(in_stack_fffffffffffff658 >> 0x20),
                (int)in_stack_fffffffffffff658,(size_t)in_stack_fffffffffffff650,
                in_stack_fffffffffffff648);
    local_480 = local_580;
    bVar3 = true;
    if (local_580->data != (void *)0x0) {
      local_2f0 = local_580;
      bVar3 = local_580->cstep * (long)local_580->c == 0;
    }
    if (bVar3) {
      local_49c = -100;
    }
    else {
      for (local_584 = 0; local_584 < local_564; local_584 = local_584 + 1) {
        local_418 = local_580;
        local_41c = local_584;
        local_590 = (void *)((long)local_580->data +
                            (long)local_580->w * (long)local_584 * local_580->elemsize);
        for (local_598 = 0; uVar5 = local_598,
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0),
            uVar5 < sVar2; local_598 = local_598 + 1) {
          local_5a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_4b0,local_598);
          local_3fc = local_584;
          local_5a8 = (void *)((long)local_5a0->data +
                              (long)local_5a0->w * (long)local_584 * local_5a0->elemsize);
          local_3f8 = local_5a0;
          memcpy(local_590,local_5a8,(long)local_5a0->w * local_4d0);
          local_590 = (void *)((long)local_5a0->w * local_4d0 + (long)local_590);
        }
      }
      local_49c = 0;
    }
  }
  else if ((local_4c4 == 3) && (local_834 == 0)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_5ac = pvVar1->w;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_5b0 = pvVar1->h;
    local_5b4 = 0;
    local_5c0 = 0;
    while( true ) {
      uVar5 = local_5c0;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0);
      iVar4 = (int)((ulong)in_stack_fffffffffffff660 >> 0x20);
      if (sVar2 <= uVar5) break;
      local_5c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4b0,local_5c0);
      local_5b4 = local_5c8->c + local_5b4;
      local_5c0 = local_5c0 + 1;
    }
    local_5d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b8,0);
    Mat::create(in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
                (int)in_stack_fffffffffffff668,iVar4,in_stack_fffffffffffff658,
                in_stack_fffffffffffff650);
    local_488 = local_5d0;
    bVar3 = true;
    if (local_5d0->data != (void *)0x0) {
      local_2e8 = local_5d0;
      bVar3 = local_5d0->cstep * (long)local_5d0->c == 0;
    }
    if (bVar3) {
      local_49c = -100;
    }
    else {
      local_5d4 = 0;
      for (local_5e0 = 0; uVar5 = local_5e0,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0), uVar5 < sVar2
          ; local_5e0 = local_5e0 + 1) {
        local_5e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_4b0,local_5e0);
        local_5ec = local_5e8->c;
        local_5f8 = local_5e8->cstep * (long)local_5ec;
        local_600 = local_5e8->data;
        local_3b0 = &local_650;
        local_234 = local_5d0->w;
        local_238 = local_5d0->h;
        local_23c = local_5d0->d;
        local_608 = (void *)((long)local_5d0->data +
                            local_5d0->cstep * (long)local_5d4 * local_5d0->elemsize);
        local_250 = local_5d0->elemsize;
        local_254 = local_5d0->elempack;
        local_260 = local_5d0->allocator;
        local_230 = &local_650;
        local_190 = (long)local_234 * (long)local_238 * local_250;
        local_458 = &local_650;
        local_390 = &local_650;
        local_194 = 0x10;
        local_3b8 = local_5d0;
        local_3bc = local_5d4;
        local_3bd = 1;
        local_650 = 0;
        local_640 = 0;
        local_638 = 0;
        local_628 = 0;
        local_624 = 0;
        local_620 = 0;
        local_61c = 0;
        local_618 = 0;
        local_610 = 0;
        local_648 = 0;
        local_438 = local_5e8;
        local_248 = local_608;
        local_b0 = local_390;
        local_630 = local_260;
        memcpy(local_608,local_600,local_5f8 * local_4d0);
        local_5d4 = local_5ec + local_5d4;
      }
      local_49c = 0;
    }
  }
  else if ((local_4c4 == 3) && (local_834 == 1)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_660 = pvVar1->w;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_664 = pvVar1->c;
    local_668 = 0;
    local_670 = 0;
    while( true ) {
      uVar5 = local_670;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0);
      iVar4 = (int)((ulong)in_stack_fffffffffffff660 >> 0x20);
      if (sVar2 <= uVar5) break;
      local_678 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4b0,local_670);
      local_668 = local_678->h + local_668;
      local_670 = local_670 + 1;
    }
    local_680 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b8,0);
    Mat::create(in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
                (int)in_stack_fffffffffffff668,iVar4,in_stack_fffffffffffff658,
                in_stack_fffffffffffff650);
    local_490 = local_680;
    bVar3 = true;
    if (local_680->data != (void *)0x0) {
      local_2e0 = local_680;
      bVar3 = local_680->cstep * (long)local_680->c == 0;
    }
    if (bVar3) {
      local_49c = -100;
    }
    else {
      for (local_684 = 0; local_684 < local_664; local_684 = local_684 + 1) {
        local_3c8 = &local_6d8;
        local_1fc = local_680->w;
        local_200 = local_680->h;
        local_204 = local_680->d;
        local_690 = (void *)((long)local_680->data +
                            local_680->cstep * (long)local_684 * local_680->elemsize);
        local_218 = local_680->elemsize;
        local_21c = local_680->elempack;
        local_228 = local_680->allocator;
        local_1f8 = &local_6d8;
        local_1a0 = (long)local_1fc * (long)local_200 * local_218;
        local_460 = &local_6d8;
        local_380 = &local_6d8;
        local_1a4 = 0x10;
        local_3d0 = local_680;
        local_3d4 = local_684;
        local_3d5 = 1;
        local_6d8 = 0;
        local_6c8 = 0;
        local_6c0 = 0;
        local_6b0 = 0;
        local_6ac = 0;
        local_6a8 = 0;
        local_6a4 = 0;
        local_6a0 = 0;
        local_698 = 0;
        local_6d0 = 0;
        local_210 = local_690;
        local_d0 = local_380;
        local_6b8 = local_228;
        for (local_6e0 = 0; uVar5 = local_6e0,
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0),
            uVar5 < sVar2; local_6e0 = local_6e0 + 1) {
          local_6e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_4b0,local_6e0);
          local_6ec = local_6e8->w * local_6e8->h;
          local_310 = &local_740;
          local_2a4 = local_6e8->w;
          local_2a8 = local_6e8->h;
          local_2ac = local_6e8->d;
          local_6f8 = (void *)((long)local_6e8->data +
                              local_6e8->cstep * (long)local_684 * local_6e8->elemsize);
          local_2c0 = local_6e8->elemsize;
          local_2c4 = local_6e8->elempack;
          local_2d0 = local_6e8->allocator;
          local_2a0 = &local_740;
          local_170 = (long)local_2a4 * (long)local_2a8 * local_2c0;
          local_440 = &local_740;
          local_370 = &local_740;
          local_174 = 0x10;
          local_31c = local_684;
          local_31d = 1;
          local_740 = 0;
          local_730 = 0;
          local_728 = 0;
          local_718 = 0;
          local_714 = 0;
          local_710 = 0;
          local_70c = 0;
          local_708 = 0;
          local_700 = 0;
          local_738 = 0;
          local_318 = local_6e8;
          local_2b8 = local_6f8;
          local_f0 = local_370;
          local_720 = local_2d0;
          memcpy(local_690,local_6f8,(long)local_6ec * local_4d0);
          local_690 = (void *)((long)local_6ec * local_4d0 + (long)local_690);
        }
      }
      local_49c = 0;
    }
  }
  else if ((local_4c4 == 3) && (local_834 == 2)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_744 = pvVar1->h;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b0,0);
    local_748 = pvVar1->c;
    local_74c = 0;
    local_758 = 0;
    while( true ) {
      uVar5 = local_758;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0);
      iVar4 = (int)((ulong)in_stack_fffffffffffff660 >> 0x20);
      if (sVar2 <= uVar5) break;
      local_760 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4b0,local_758);
      local_74c = local_760->w + local_74c;
      local_758 = local_758 + 1;
    }
    local_768 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4b8,0);
    Mat::create(in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
                (int)in_stack_fffffffffffff668,iVar4,in_stack_fffffffffffff658,
                in_stack_fffffffffffff650);
    local_498 = local_768;
    bVar3 = true;
    if (local_768->data != (void *)0x0) {
      local_2d8 = local_768;
      bVar3 = local_768->cstep * (long)local_768->c == 0;
    }
    if (bVar3) {
      local_49c = -100;
    }
    else {
      for (local_76c = 0; local_76c < local_748; local_76c = local_76c + 1) {
        local_3e0 = &local_7c0;
        local_1c4 = local_768->w;
        local_1c8 = local_768->h;
        local_1cc = local_768->d;
        local_778 = (void *)((long)local_768->data +
                            local_768->cstep * (long)local_76c * local_768->elemsize);
        local_1e0 = local_768->elemsize;
        local_1e4 = local_768->elempack;
        local_1f0 = local_768->allocator;
        local_1c0 = &local_7c0;
        local_1b0 = (long)local_1c4 * (long)local_1c8 * local_1e0;
        local_468 = &local_7c0;
        local_360 = &local_7c0;
        local_1b4 = 0x10;
        local_3e8 = local_768;
        local_3ec = local_76c;
        local_3ed = 1;
        local_7c0 = 0;
        local_7b0 = 0;
        local_7a8 = 0;
        local_798 = 0;
        local_794 = 0;
        local_790 = 0;
        local_78c = 0;
        local_788 = 0;
        local_780 = 0;
        local_7b8 = 0;
        local_1d8 = local_778;
        local_110 = local_360;
        local_7a0 = local_1f0;
        for (local_7c4 = 0; local_7c4 < local_744; local_7c4 = local_7c4 + 1) {
          local_7d0 = 0;
          while (uVar5 = local_7d0,
                sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4b0),
                uVar5 < sVar2) {
            local_7d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  (local_4b0,local_7d0);
            local_330 = &local_828;
            local_26c = local_7d8->w;
            local_270 = local_7d8->h;
            local_274 = local_7d8->d;
            local_280 = (void *)((long)local_7d8->data +
                                local_7d8->cstep * (long)local_76c * local_7d8->elemsize);
            local_288 = local_7d8->elemsize;
            local_28c = local_7d8->elempack;
            local_298 = local_7d8->allocator;
            local_268 = &local_828;
            local_180 = (long)local_26c * (long)local_270 * local_288;
            local_408 = &local_828;
            local_7e0 = (void *)((long)local_280 + (long)local_26c * (long)local_7c4 * local_288);
            local_350 = &local_828;
            local_184 = 0x10;
            local_33c = local_76c;
            local_33d = 1;
            local_40c = local_7c4;
            local_828 = 0;
            local_818 = 0;
            local_810 = 0;
            local_800 = 0;
            local_7fc = 0;
            local_7f8 = 0;
            local_7f4 = 0;
            local_7f0 = 0;
            local_7e8 = 0;
            local_820 = 0;
            local_338 = local_7d8;
            local_130 = local_350;
            local_808 = local_298;
            memcpy(local_778,local_7e0,(long)local_7d8->w * local_4d0);
            local_778 = (void *)((long)local_7d8->w * local_4d0 + (long)local_778);
            local_7d0 = local_7d0 + 1;
          }
        }
      }
      local_49c = 0;
    }
  }
  else {
    local_49c = 0;
  }
  return local_49c;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const unsigned char* ptr = bottom_blob.channel(q).row<const unsigned char>(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elemsize;
                }
            }
        }

        return 0;
    }

    return 0;
}